

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.cc
# Opt level: O2

ostream * absl::lts_20240722::time_internal::cctz::detail::operator<<(ostream *os,civil_hour *h)

{
  ushort uVar1;
  ostream *poVar2;
  civil_day local_1c0 [2];
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_1c0[0].f_.y = (h->f_).y;
  uVar1._0_1_ = (h->f_).m;
  uVar1._1_1_ = (h->f_).d;
  local_1c0[0].f_._8_4_ = ZEXT24(uVar1);
  local_1c0[0].f_.ss = '\0';
  poVar2 = operator<<(local_190,local_1c0);
  std::operator<<(poVar2,'T');
  poVar2 = std::operator<<(local_190,0x30);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
  std::ostream::operator<<((ostream *)poVar2,(int)(h->f_).hh);
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(os,(string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const civil_hour& h) {
  std::stringstream ss;
  ss << civil_day(h) << 'T';
  ss << std::setfill('0') << std::setw(2) << h.hour();
  return os << ss.str();
}